

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationLeakyReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_leakyrelu(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0xf) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0xf;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationLeakyReLU::ActivationLeakyReLU((ActivationLeakyReLU *)this_00);
    (this->NonlinearityType_).leakyrelu_ = (ActivationLeakyReLU *)this_00;
  }
  return (ActivationLeakyReLU *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationLeakyReLU* ActivationParams::mutable_leakyrelu() {
  if (!has_leakyrelu()) {
    clear_NonlinearityType();
    set_has_leakyrelu();
    NonlinearityType_.leakyrelu_ = new ::CoreML::Specification::ActivationLeakyReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.leakyReLU)
  return NonlinearityType_.leakyrelu_;
}